

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O0

string * __thiscall
handlegraph::PathMetadata::get_sample_name_abi_cxx11_(PathMetadata *this,path_handle_t *handle)

{
  undefined8 in_RDX;
  long *in_RSI;
  string *in_RDI;
  string local_38 [48];
  string *path_name;
  
  path_name = in_RDI;
  (**(code **)(*in_RSI + 0x50))(local_38,in_RSI,in_RDX);
  parse_sample_name(path_name);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string PathMetadata::get_sample_name(const path_handle_t& handle) const {
    return PathMetadata::parse_sample_name(get_path_name(handle));
}